

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl.cpp
# Opt level: O2

int __thiscall arbiter::http::Curl::init(Curl *this,EVP_PKEY_CTX *ctx)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  int iVar2;
  long lVar3;
  curl_slist *pcVar4;
  _Rb_tree_node_base *p_Var5;
  Query *in_RCX;
  long in_RDX;
  string local_90;
  string path;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  curl_slist_free_all(this->m_headers);
  this->m_headers = (curl_slist *)0x0;
  buildQueryString(&local_90,in_RCX);
  ::std::operator+(&path,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ctx,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_90);
  ::std::__cxx11::string::~string((string *)&local_90);
  curl_easy_setopt(this->m_curl,0x2712,path._M_dataplus._M_p);
  lVar3 = curl_version_info(9);
  if ((*(byte *)(lVar3 + 0x20) & 0x80) == 0) {
    curl_easy_setopt(this->m_curl,99,1);
  }
  curl_easy_setopt(this->m_curl,0x71,1);
  curl_easy_setopt(this->m_curl,0x2776,"");
  curl_easy_setopt(this->m_curl,0x13,1);
  curl_easy_setopt(this->m_curl,0x14,this->m_timeout);
  curl_easy_setopt(this->m_curl,0x9c,1000);
  curl_easy_setopt(this->m_curl,0xd4,1000);
  curl_easy_setopt(this->m_curl,0x29,this->m_verbose);
  curl_easy_setopt(this->m_curl,0x34,this->m_followRedirect);
  curl_easy_setopt(this->m_curl,0x40,this->m_verifyPeer);
  pbVar1 = (this->m_caPath)._M_t.
           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl;
  if (pbVar1 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    curl_easy_setopt(this->m_curl,0x2771,(pbVar1->_M_dataplus)._M_p);
  }
  pbVar1 = (this->m_caInfo)._M_t.
           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl;
  if (pbVar1 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    curl_easy_setopt(this->m_curl,0x2751,(pbVar1->_M_dataplus)._M_p);
  }
  pbVar1 = (this->m_proxy)._M_t.
           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl;
  if (pbVar1 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    curl_easy_setopt(this->m_curl,0x2714,(pbVar1->_M_dataplus)._M_p);
  }
  for (p_Var5 = *(_Rb_tree_node_base **)(in_RDX + 0x18);
      p_Var5 != (_Rb_tree_node_base *)(in_RDX + 8);
      p_Var5 = (_Rb_tree_node_base *)::std::_Rb_tree_increment(p_Var5)) {
    pcVar4 = this->m_headers;
    ::std::operator+(&local_50,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (p_Var5 + 1),": ");
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_90,
                     &local_50,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (p_Var5 + 2));
    pcVar4 = (curl_slist *)curl_slist_append(pcVar4,local_90._M_dataplus._M_p);
    this->m_headers = pcVar4;
    ::std::__cxx11::string::~string((string *)&local_90);
    ::std::__cxx11::string::~string((string *)&local_50);
  }
  iVar2 = ::std::__cxx11::string::~string((string *)&path);
  return iVar2;
}

Assistant:

void Curl::init(
        const std::string rawPath,
        const Headers& headers,
        const Query& query)
{
#ifdef ARBITER_CURL
    // Reset our curl instance and header list.
    curl_slist_free_all(m_headers);
    m_headers = nullptr;

    // Set path.
    const std::string path(rawPath + buildQueryString(query));
    curl_easy_setopt(m_curl, CURLOPT_URL, path.c_str());

    curl_version_info_data* versioninfo = curl_version_info(CURLVERSION_NOW);
    if (!(versioninfo->features & CURL_VERSION_ASYNCHDNS))
    {
        curl_easy_setopt(m_curl, CURLOPT_NOSIGNAL, 1L);
    }

    // Substantially faster DNS lookups without IPv6.
    curl_easy_setopt(m_curl, CURLOPT_IPRESOLVE, CURL_IPRESOLVE_V4);

    // See https://curl.se/libcurl/c/CURLOPT_ACCEPT_ENCODING.html
    //
    // To aid applications not having to bother about what specific algorithms
    // this particular libcurl build supports, libcurl allows a zero-length
    // string to be set ("") to ask for an Accept-Encoding: header to be used
    // that contains all built-in supported encodings.
    curl_easy_setopt(m_curl, CURLOPT_ACCEPT_ENCODING, "");

    // Don't wait forever.  Use the low-speed options instead of the timeout
    // option to make the timeout a sliding window instead of an absolute.
    curl_easy_setopt(m_curl, CURLOPT_LOW_SPEED_LIMIT, 1L);
    curl_easy_setopt(m_curl, CURLOPT_LOW_SPEED_TIME, m_timeout);

    curl_easy_setopt(m_curl, CURLOPT_CONNECTTIMEOUT_MS, 1000L);
    curl_easy_setopt(m_curl, CURLOPT_ACCEPTTIMEOUT_MS, 1000L);

    auto toLong([](bool b) { return b ? 1L : 0L; });

    // Configuration options.
    curl_easy_setopt(m_curl, CURLOPT_VERBOSE, toLong(m_verbose));
    curl_easy_setopt(m_curl, CURLOPT_FOLLOWLOCATION, toLong(m_followRedirect));
    curl_easy_setopt(m_curl, CURLOPT_SSL_VERIFYPEER, toLong(m_verifyPeer));
    if (m_caPath) curl_easy_setopt(m_curl, CURLOPT_CAPATH, m_caPath->c_str());
    if (m_caInfo) curl_easy_setopt(m_curl, CURLOPT_CAINFO, m_caInfo->c_str());
    if (m_proxy) curl_easy_setopt(m_curl, CURLOPT_PROXY, m_proxy->c_str());

    // Insert supplied headers.
    for (const auto& h : headers)
    {
        m_headers = curl_slist_append(
                m_headers,
                (h.first + ": " + h.second).c_str());
    }
#else
    throw ArbiterError(fail);
#endif
}